

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O0

int Col_ListIterMoveTo(ColListIterator *it,size_t index)

{
  size_t index_local;
  ColListIterator *it_local;
  
  if (it->index < index) {
    it_local._4_4_ = Col_ListIterForward(it,index - it->index);
  }
  else if (index < it->index) {
    Col_ListIterBackward(it,it->index - index);
    it_local._4_4_ = 0;
  }
  else {
    it_local._4_4_ = 0;
  }
  return it_local._4_4_;
}

Assistant:

int
Col_ListIterMoveTo(
    Col_ListIterator it,    /*!< The iterator to move. */
    size_t index)           /*!< Position to move to. */
{
    if (index > it->index) {
        return Col_ListIterForward(it, index - it->index);
    } else if (index < it->index) {
        Col_ListIterBackward(it, it->index - index);
        return 0;
    } else {
        return 0;
    }
}